

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportedUgridFactory.h
# Opt level: O0

void Parfait::ImportedUgridFactory::createBoundaryConditionsFromTags
               (string *filename,vector<int,_std::allocator<int>_> *triangleTags,
               vector<int,_std::allocator<int>_> *quadTags,
               vector<int,_std::allocator<int>_> *triangleBoundaryConditions,
               vector<int,_std::allocator<int>_> *quadBoundaryConditions)

{
  bool bVar1;
  size_type sVar2;
  reference piVar3;
  int local_120;
  int local_11c;
  iterator iStack_118;
  int tag_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  iterator iStack_f8;
  int tag;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined1 local_c0 [8];
  MapbcReader reader;
  size_type position;
  string local_50 [8];
  string mapbcFile;
  vector<int,_std::allocator<int>_> *quadBoundaryConditions_local;
  vector<int,_std::allocator<int>_> *triangleBoundaryConditions_local;
  vector<int,_std::allocator<int>_> *quadTags_local;
  vector<int,_std::allocator<int>_> *triangleTags_local;
  string *filename_local;
  
  std::__cxx11::string::string(local_50,(string *)filename);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)local_50);
  reader.bcMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       std::__cxx11::string::find((char *)local_50,0x11d295);
  if (reader.bcMap._M_t._M_impl.super__Rb_tree_header._M_node_count != 0xffffffffffffffff) {
    std::__cxx11::string::resize((ulong)local_50);
  }
  reader.bcMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       std::__cxx11::string::find((char *)local_50,0x11d1e2);
  if (reader.bcMap._M_t._M_impl.super__Rb_tree_header._M_node_count != 0xffffffffffffffff) {
    std::__cxx11::string::resize((ulong)local_50);
  }
  std::__cxx11::string::operator+=(local_50,"mapbc");
  std::__cxx11::string::string((string *)&__range1,local_50);
  MapbcReader::MapbcReader((MapbcReader *)local_c0,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  std::vector<int,_std::allocator<int>_>::clear(triangleBoundaryConditions);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(triangleTags);
  std::vector<int,_std::allocator<int>_>::reserve(triangleBoundaryConditions,sVar2);
  std::vector<int,_std::allocator<int>_>::clear(quadBoundaryConditions);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(quadTags);
  std::vector<int,_std::allocator<int>_>::reserve(quadBoundaryConditions,sVar2);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(triangleTags);
  iStack_f8 = std::vector<int,_std::allocator<int>_>::end(triangleTags);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff08);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    __range1_1._4_4_ = *piVar3;
    __range1_1._0_4_ = MapbcReader::boundaryCondition((MapbcReader *)local_c0,__range1_1._4_4_);
    std::vector<int,_std::allocator<int>_>::push_back
              (triangleBoundaryConditions,(value_type_conflict1 *)&__range1_1);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin(quadTags);
  iStack_118 = std::vector<int,_std::allocator<int>_>::end(quadTags);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xfffffffffffffee8);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    local_11c = *piVar3;
    local_120 = MapbcReader::boundaryCondition((MapbcReader *)local_c0,local_11c);
    std::vector<int,_std::allocator<int>_>::push_back(quadBoundaryConditions,&local_120);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  MapbcReader::~MapbcReader((MapbcReader *)local_c0);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

inline void ImportedUgridFactory::createBoundaryConditionsFromTags(
            std::string filename,
            std::vector<int> &triangleTags,
            std::vector<int> &quadTags,
            std::vector<int> &triangleBoundaryConditions,
            std::vector<int> &quadBoundaryConditions
    ) {

        std::string mapbcFile = filename;
        mapbcFile.resize(filename.size() - 5);
        auto position = mapbcFile.find("lb8.");
        if (std::string::npos != position)
            mapbcFile.resize(position);
        position = mapbcFile.find("b8.");
        if (std::string::npos != position)
            mapbcFile.resize(position);
        mapbcFile += "mapbc";
        MapbcReader reader(mapbcFile);

        triangleBoundaryConditions.clear();
        triangleBoundaryConditions.reserve(triangleTags.size());
        quadBoundaryConditions.clear();
        quadBoundaryConditions.reserve(quadTags.size());

        for (int tag:triangleTags)
            triangleBoundaryConditions.push_back(reader.boundaryCondition(tag));
        for (int tag:quadTags)
            quadBoundaryConditions.push_back(reader.boundaryCondition(tag));
    }